

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::TrySimpleIntegerCast<unsigned_long,false>
               (char *buf,idx_t len,unsigned_long *result,bool strict)

{
  long lVar1;
  byte bVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  idx_t iVar4;
  int iVar5;
  char *pcVar6;
  byte bVar7;
  int iVar8;
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  IntegerCastData<short> local_6a;
  IntegerDecimalCastData<unsigned_long> local_68;
  undefined8 local_48;
  undefined8 local_40;
  ulong *local_38;
  
  uVar3 = CONCAT71(in_register_00000009,strict);
  if (len != 0) {
    uVar13 = 0;
    do {
      bVar2 = buf[uVar13];
      uVar3 = CONCAT71((int7)(uVar3 >> 8),bVar2);
      uVar12 = (uint)bVar2;
      if ((4 < uVar12 - 9) && (uVar12 != 0x20)) {
        if (uVar12 == 0x2d) {
          uVar14 = len - uVar13;
          uVar3 = 1;
          goto LAB_00cf07be;
        }
        if (bVar2 != 0x30 || len - 1 == uVar13) {
LAB_00cf0971:
          local_40 = CONCAT44(local_40._4_4_,3);
          uVar11 = len - uVar13;
          local_48 = (ulong)(bVar2 == 0x2b);
          uVar3 = 0;
          uVar14 = local_48;
          goto LAB_00cf098d;
        }
        cVar9 = buf[uVar13 + 1];
        if (cVar9 != 'B') {
          if (cVar9 != 'x') {
            if (cVar9 == 'b') goto LAB_00cf0c46;
            if (cVar9 != 'X') goto LAB_00cf0971;
          }
          uVar3 = 0;
          uVar11 = 1;
          goto LAB_00cf087f;
        }
LAB_00cf0c46:
        uVar14 = ~uVar13 + len;
        bVar18 = 1 < uVar14;
        if (!bVar18) {
          uVar3 = 0;
          goto LAB_00cf07dd;
        }
        uVar3 = 0;
        uVar11 = 1;
        goto LAB_00cf0c5f;
      }
      uVar13 = uVar13 + 1;
    } while (len != uVar13);
  }
  bVar18 = false;
  goto LAB_00cf07dd;
  while (lVar1 = uVar13 + uVar3, uVar3 = uVar3 + 1, buf[lVar1] == '0') {
LAB_00cf07be:
    if (uVar14 <= uVar3) {
      uVar3 = 0;
      uVar11 = 1;
      goto LAB_00cf0a74;
    }
  }
  uVar3 = 0;
LAB_00cf07d7:
  bVar18 = false;
  goto LAB_00cf07dd;
  while( true ) {
    uVar10 = uVar11 + 1;
    bVar17 = true;
    if ((~uVar11 + len != uVar13) && (buf[uVar13 + 1 + uVar11] == '_')) {
      uVar10 = uVar11 + 2;
      if ((len - uVar11) - 2 == uVar13) {
        bVar17 = false;
      }
      else {
        bVar17 = (byte)(buf[uVar13 + uVar10] - 0x30U) < 10;
      }
    }
    uVar3 = uVar3 * 10 - (ulong)bVar2;
    bVar18 = false;
    uVar11 = uVar10;
    if (!bVar17) break;
LAB_00cf0a74:
    if (uVar14 <= uVar11) goto LAB_00cf1201;
    bVar2 = buf[uVar13 + uVar11] - 0x30;
    if (9 < bVar2) {
      if (buf[uVar13 + uVar11] == '.') {
        uVar10 = uVar11 + 1;
        if (uVar10 < uVar14) {
          iVar5 = 0;
          if (9 < (byte)(buf[uVar13 + 1 + uVar11] - 0x30U)) goto LAB_00cf1193;
          iVar8 = 1;
        }
        else {
          iVar5 = 3;
LAB_00cf1193:
          iVar8 = 1;
          if (1 < uVar11) {
            iVar8 = iVar5;
          }
        }
        uVar11 = uVar10;
        if (iVar8 == 3) goto LAB_00cf1201;
        if (iVar8 != 0) goto LAB_00cf07d7;
      }
      bVar18 = false;
      if (((ulong)(byte)buf[uVar13 + uVar11] < 0x21) &&
         (bVar18 = false, (0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar11] & 0x3f) & 1) != 0)) {
        uVar10 = uVar11 + 1;
        uVar11 = uVar10;
        if (uVar14 <= uVar10) goto LAB_00cf1201;
        goto LAB_00cf11d5;
      }
      break;
    }
  }
  goto LAB_00cf07dd;
  while (uVar10 = uVar10 + 1, uVar11 = uVar14, uVar14 != uVar10) {
LAB_00cf11d5:
    if ((0x20 < (ulong)(byte)buf[uVar13 + uVar10]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar10] & 0x3f) & 1) == 0)) goto LAB_00cf07d7;
  }
LAB_00cf1201:
  bVar18 = 1 < uVar11;
  goto LAB_00cf07dd;
  while( true ) {
    uVar10 = uVar14 + 1;
    bVar17 = false;
    if (uVar3 <= ~(ulong)bVar2 / 10) {
      uVar3 = uVar3 * 10 + (ulong)bVar2;
      bVar17 = true;
      if ((~uVar14 + len != uVar13) && (buf[uVar13 + 1 + uVar14] == '_')) {
        uVar10 = uVar14 + 2;
        if ((len - uVar14) - 2 == uVar13) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(buf[uVar13 + uVar10] - 0x30U) < 10;
        }
      }
    }
    bVar18 = false;
    uVar14 = uVar10;
    if (!bVar17) break;
LAB_00cf098d:
    if (uVar11 <= uVar14) goto LAB_00cf0f19;
    bVar2 = buf[uVar13 + uVar14] - 0x30;
    if (9 < bVar2) {
      if (buf[uVar13 + uVar14] == '.') {
        uVar10 = uVar14 + 1;
        if ((uVar10 < uVar11) &&
           (local_40 = (ulong)local_40._4_4_ << 0x20, (byte)(buf[uVar13 + 1 + uVar14] - 0x30U) < 10)
           ) {
          iVar5 = 1;
        }
        else {
          iVar5 = 1;
          if (local_48 < uVar14) {
            iVar5 = (int)local_40;
          }
        }
        uVar14 = uVar10;
        if (iVar5 == 3) goto LAB_00cf0f19;
        if (iVar5 != 0) goto LAB_00cf07d7;
      }
      bVar18 = false;
      if (((ulong)(byte)buf[uVar13 + uVar14] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar14] & 0x3f) & 1) != 0)) {
        uVar10 = uVar14 + 1;
        uVar14 = uVar10;
        if (uVar11 <= uVar10) goto LAB_00cf0f19;
        goto LAB_00cf0ef1;
      }
      break;
    }
  }
  goto LAB_00cf07dd;
  while (uVar10 = uVar10 + 1, uVar14 = uVar11, uVar11 != uVar10) {
LAB_00cf0ef1:
    if ((0x20 < (ulong)(byte)buf[uVar13 + uVar10]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar13 + uVar10] & 0x3f) & 1) == 0)) goto LAB_00cf07d7;
  }
LAB_00cf0f19:
  bVar18 = local_48 < uVar14;
  goto LAB_00cf07dd;
LAB_00cf087f:
  do {
    if (~uVar13 + len <= uVar11) goto LAB_00cf1201;
    bVar2 = buf[uVar13 + 1 + uVar11];
    bVar7 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar7 = bVar2;
    }
    if (9 < (byte)(bVar7 - 0x30)) {
      bVar18 = false;
      if ((0x25 < bVar7 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar7 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar9 = -0x57;
    if ((char)bVar7 < 'a') {
      cVar9 = -0x30;
    }
    uVar14 = uVar11 + 1;
    if (((len - uVar11) - 2 == uVar13) || (buf[uVar13 + 2 + uVar11] != '_')) {
LAB_00cf093b:
      bVar17 = uVar3 <= ~(ulong)(byte)(cVar9 + bVar7) >> 4;
      if (bVar17) {
        uVar3 = uVar3 * 0x10 + (ulong)(byte)(cVar9 + bVar7);
      }
    }
    else {
      uVar14 = uVar11 + 2;
      if ((len - uVar11) - 3 != uVar13) {
        if (9 < (byte)(buf[uVar13 + 3 + uVar11] - 0x30U)) {
          bVar17 = false;
          uVar12 = (byte)buf[uVar13 + 3 + uVar11] - 0x41;
          if ((0x25 < uVar12) || ((0x3f0000003fU >> ((ulong)uVar12 & 0x3f) & 1) == 0))
          goto LAB_00cf0961;
        }
        goto LAB_00cf093b;
      }
      bVar17 = false;
    }
LAB_00cf0961:
    bVar18 = false;
    uVar11 = uVar14;
  } while (bVar17);
  goto LAB_00cf07dd;
  while (lVar1 = uVar3 + uVar14, uVar14 = uVar14 + 1, buf[lVar1] == '0') {
LAB_00cf0a52:
    if (uVar13 <= uVar14) {
      local_68.result = 0;
      uVar14 = 1;
      goto LAB_00cf0e05;
    }
  }
  goto LAB_00cf0816;
  while( true ) {
    bVar2 = buf[uVar3 + uVar14] - 0x30;
    if (9 < bVar2) {
      if (buf[uVar3 + uVar14] != '.') goto LAB_00cf1380;
      uVar11 = uVar14 + 1;
      if (uVar13 <= uVar11) {
        iVar8 = 3;
        uVar15 = uVar11;
        goto LAB_00cf135a;
      }
      local_68.decimal = 0;
      local_48 = CONCAT44(local_48._4_4_,3);
      uVar10 = uVar11;
      goto LAB_00cf110f;
    }
    uVar11 = uVar14 + 1;
    bVar18 = true;
    if ((~uVar14 + len != uVar3) && (buf[uVar3 + 1 + uVar14] == '_')) {
      uVar11 = uVar14 + 2;
      if ((len - uVar14) - 2 == uVar3) {
        bVar18 = false;
      }
      else {
        bVar18 = (byte)(buf[uVar3 + uVar11] - 0x30U) < 10;
      }
    }
    local_68.result = local_68.result * 10 - (ulong)bVar2;
    uVar14 = uVar11;
    if (!bVar18) break;
LAB_00cf0e05:
    if (uVar13 <= uVar14) goto LAB_00cf10bd;
  }
  goto LAB_00cf0814;
  while( true ) {
    if (local_68.decimal <= ~(ulong)bVar2 / 10) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar2;
    }
    uVar15 = uVar10 + 1;
    if (((~uVar10 + len != uVar3) && (buf[uVar3 + 1 + uVar10] == '_')) &&
       ((uVar15 = uVar10 + 2, (len - uVar10) - 2 == uVar3 ||
        (9 < (byte)(buf[uVar3 + uVar15] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar5 = 1;
      goto LAB_00cf136f;
    }
    uVar10 = uVar15;
    if (uVar13 <= uVar15) break;
LAB_00cf110f:
    bVar2 = buf[uVar3 + uVar10] - 0x30;
    if (9 < bVar2) {
      local_48 = (ulong)local_48._4_4_ << 0x20;
      uVar15 = uVar10;
      break;
    }
  }
  local_68._18_6_ = 0;
  iVar8 = (int)local_48;
LAB_00cf135a:
  iVar5 = 1;
  if (uVar11 < uVar15) {
    iVar5 = iVar8;
  }
  if (1 < uVar14) {
    iVar5 = iVar8;
  }
LAB_00cf136f:
  uVar14 = uVar15;
  if (iVar5 == 3) {
LAB_00cf10bd:
    bVar18 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,true>(&local_68);
    if (bVar18) {
      bVar18 = 1 < uVar14;
      goto LAB_00cf0816;
    }
  }
  else if (iVar5 == 0) {
LAB_00cf1380:
    bVar2 = buf[uVar3 + uVar14];
    if (bVar2 - 9 < 5) {
LAB_00cf1392:
      uVar11 = uVar14 + 1;
      uVar14 = uVar11;
      if (uVar11 < uVar13) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar3 + uVar11]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar3 + uVar11] & 0x3f) & 1) == 0))
          goto LAB_00cf0814;
          uVar11 = uVar11 + 1;
          uVar14 = uVar13;
        } while (uVar13 != uVar11);
      }
      goto LAB_00cf10bd;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar14 != 1) && (uVar14 + 1 < uVar13)) {
        local_6a.result = 0;
        pcVar6 = buf + uVar3 + uVar14 + 1;
        iVar4 = ~uVar3 + (len - uVar14);
        if (*pcVar6 == '-') {
          bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar6,iVar4,&local_6a,SUB81(iVar4,0));
        }
        else {
          bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar6,iVar4,&local_6a,SUB81(iVar4,0));
        }
        if (bVar18 != false) {
          bVar18 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,true>
                             (&local_68,local_6a.result);
          goto LAB_00cf0816;
        }
      }
    }
    else if (bVar2 == 0x20) goto LAB_00cf1392;
  }
  goto LAB_00cf0814;
  while( true ) {
    bVar2 = buf[uVar3 + uVar14] - 0x30;
    if (9 < bVar2) {
      if (buf[uVar3 + uVar14] != '.') goto LAB_00cf1299;
      uVar10 = uVar14 + 1;
      if (uVar13 <= uVar10) {
        iVar8 = 3;
        uVar16 = uVar10;
        goto LAB_00cf1274;
      }
      local_68.decimal = 0;
      local_48 = CONCAT44(local_48._4_4_,3);
      uVar15 = uVar10;
      goto LAB_00cf1035;
    }
    uVar10 = uVar14 + 1;
    bVar18 = false;
    if (local_68.result <= ~(ulong)bVar2 / 10) {
      local_68.result = local_68.result * 10 + (ulong)bVar2;
      bVar18 = true;
      if ((~uVar14 + len != uVar3) && (buf[uVar3 + 1 + uVar14] == '_')) {
        uVar10 = uVar14 + 2;
        if ((len - uVar14) - 2 == uVar3) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(buf[uVar3 + uVar10] - 0x30U) < 10;
        }
      }
    }
    uVar14 = uVar10;
    if (!bVar18) break;
LAB_00cf0d31:
    if (uVar13 <= uVar14) goto LAB_00cf0f2c;
  }
  goto LAB_00cf0814;
  while( true ) {
    if (local_68.decimal <= ~(ulong)bVar2 / 10) {
      local_68.decimal_digits = local_68.decimal_digits + 1;
      local_68.decimal = local_68.decimal * 10 + (ulong)bVar2;
    }
    uVar16 = uVar15 + 1;
    if (((~uVar15 + len != uVar3) && (buf[uVar3 + 1 + uVar15] == '_')) &&
       ((uVar16 = uVar15 + 2, (len - uVar15) - 2 == uVar3 ||
        (9 < (byte)(buf[uVar3 + uVar16] - 0x30U))))) {
      local_68._18_6_ = 0;
      iVar5 = 1;
      goto LAB_00cf1288;
    }
    uVar15 = uVar16;
    if (uVar13 <= uVar16) break;
LAB_00cf1035:
    bVar2 = buf[uVar3 + uVar15] - 0x30;
    local_40 = uVar10;
    if (9 < bVar2) {
      local_48 = (ulong)local_48._4_4_ << 0x20;
      uVar16 = uVar15;
      break;
    }
  }
  local_68._18_6_ = 0;
  iVar8 = (int)local_48;
LAB_00cf1274:
  iVar5 = 1;
  if (uVar10 < uVar16) {
    iVar5 = iVar8;
  }
  if (uVar11 < uVar14) {
    iVar5 = iVar8;
  }
LAB_00cf1288:
  uVar14 = uVar16;
  if (iVar5 == 3) {
LAB_00cf0f2c:
    bVar18 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_68);
    if (bVar18) {
      bVar18 = uVar11 < uVar14;
      goto LAB_00cf0816;
    }
  }
  else if (iVar5 == 0) {
LAB_00cf1299:
    bVar2 = buf[uVar3 + uVar14];
    if (bVar2 - 9 < 5) {
LAB_00cf12ab:
      uVar10 = uVar14 + 1;
      uVar14 = uVar10;
      if (uVar10 < uVar13) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar3 + uVar10]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar3 + uVar10] & 0x3f) & 1) == 0))
          goto LAB_00cf0814;
          uVar10 = uVar10 + 1;
          uVar14 = uVar13;
        } while (uVar13 != uVar10);
      }
      goto LAB_00cf0f2c;
    }
    if ((bVar2 == 0x65) || (bVar2 == 0x45)) {
      if ((uVar14 != uVar11) && (uVar14 + 1 < uVar13)) {
        local_6a.result = 0;
        pcVar6 = buf + uVar3 + uVar14 + 1;
        iVar4 = ~uVar3 + (len - uVar14);
        if (*pcVar6 == '-') {
          bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar6,iVar4,&local_6a,SUB81(iVar4,0));
        }
        else {
          bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar6,iVar4,&local_6a,SUB81(iVar4,0));
        }
        if (bVar18 != false) {
          bVar18 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_long>,false>
                             (&local_68,local_6a.result);
          goto LAB_00cf0816;
        }
      }
    }
    else if (bVar2 == 0x20) goto LAB_00cf12ab;
  }
  goto LAB_00cf0814;
LAB_00cf0b47:
  do {
    if (~uVar3 + len <= uVar13) {
      bVar18 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_68);
      bVar18 = 1 < uVar13 && bVar18;
      goto LAB_00cf0816;
    }
    bVar2 = buf[uVar3 + 1 + uVar13];
    bVar7 = bVar2 | 0x20;
    if (0x19 < (byte)(bVar2 + 0xbf)) {
      bVar7 = bVar2;
    }
    if ((9 < (byte)(bVar7 - 0x30)) &&
       ((0x25 < bVar7 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar7 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar9 = -0x57;
    if ((char)bVar7 < 'a') {
      cVar9 = -0x30;
    }
    uVar14 = uVar13 + 1;
    if (((len - uVar13) - 2 == uVar3) || (buf[uVar3 + 2 + uVar13] != '_')) {
LAB_00cf0c04:
      bVar18 = local_68.result <= ~(ulong)(byte)(cVar9 + bVar7) >> 4;
      if (bVar18) {
        local_68.result = local_68.result * 0x10 + (ulong)(byte)(cVar9 + bVar7);
      }
    }
    else {
      uVar14 = uVar13 + 2;
      if ((len - uVar13) - 3 != uVar3) {
        if (9 < (byte)(buf[uVar3 + 3 + uVar13] - 0x30U)) {
          uVar12 = (byte)buf[uVar3 + 3 + uVar13] - 0x41;
          bVar18 = false;
          if ((0x25 < uVar12) ||
             (bVar18 = false, (0x3f0000003fU >> ((ulong)uVar12 & 0x3f) & 1) == 0))
          goto LAB_00cf0c2b;
        }
        goto LAB_00cf0c04;
      }
      bVar18 = false;
    }
LAB_00cf0c2b:
    uVar13 = uVar14;
  } while (bVar18);
  goto LAB_00cf0814;
  while( true ) {
    if ((long)local_68.result < 0) goto LAB_00cf0814;
    local_68.result = uVar11 + local_68.result * 2;
    uVar14 = uVar10;
    if (uVar13 <= uVar10) break;
LAB_00cf0f68:
    if (buf[uVar3 + 1 + uVar14] == '0') {
      uVar11 = 0;
    }
    else {
      uVar11 = 1;
      if (buf[uVar3 + 1 + uVar14] != '1') goto LAB_00cf0814;
    }
    uVar10 = uVar14 + 1;
    if (((len - uVar14) - 2 != uVar3) && (buf[uVar3 + 2 + uVar14] == '_')) {
      if (((len - uVar14) - 3 == uVar3) || ((buf[uVar3 + 3 + uVar14] & 0xfeU) != 0x30))
      goto LAB_00cf0814;
      uVar10 = uVar14 + 2;
    }
  }
LAB_00cf0fe6:
  bVar18 = IntegerDecimalCastOperation::
           Finalize<duckdb::IntegerDecimalCastData<unsigned_long>,false>(&local_68);
  bVar18 = bVar18 && 1 < uVar13;
  goto LAB_00cf0816;
  while( true ) {
    uVar15 = uVar11 + 1;
    if (((len - uVar11) - 2 != uVar13) && (buf[uVar13 + 2 + uVar11] == '_')) {
      if (((len - uVar11) - 3 == uVar13) || ((buf[uVar13 + 3 + uVar11] & 0xfeU) != 0x30))
      goto LAB_00cf07d7;
      uVar15 = uVar11 + 2;
    }
    if ((long)uVar3 < 0) goto LAB_00cf07d7;
    uVar3 = uVar10 + uVar3 * 2;
    bVar18 = true;
    uVar11 = uVar15;
    if (uVar14 <= uVar15) break;
LAB_00cf0c5f:
    bVar18 = false;
    uVar10 = 0;
    if ((buf[uVar13 + 1 + uVar11] != '0') && (uVar10 = 1, buf[uVar13 + 1 + uVar11] != '1')) break;
  }
LAB_00cf07dd:
  if (bVar18) {
    *result = uVar3;
    bVar18 = true;
  }
  else {
    local_38 = result;
    if (len != 0) {
      uVar3 = 0;
      do {
        bVar2 = buf[uVar3];
        if ((0x20 < (ulong)bVar2) || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          local_68._16_8_ = 0;
          local_68.result = 0;
          local_68.decimal = 0;
          uVar13 = len - uVar3;
          local_68.decimal_digits = 0;
          if (bVar2 == 0x2d) {
            bVar18 = false;
            uVar14 = 1;
            goto LAB_00cf0a52;
          }
          if (bVar2 != 0x30 || len - 1 == uVar3) {
LAB_00cf0d1d:
            uVar11 = (ulong)(bVar2 == 0x2b);
            local_68.result = 0;
            uVar14 = uVar11;
            goto LAB_00cf0d31;
          }
          cVar9 = buf[uVar3 + 1];
          if (cVar9 != 'B') {
            if (cVar9 != 'x') {
              if (cVar9 == 'b') goto LAB_00cf0f49;
              if (cVar9 != 'X') goto LAB_00cf0d1d;
            }
            local_68.result = 0;
            uVar13 = 1;
            goto LAB_00cf0b47;
          }
LAB_00cf0f49:
          uVar13 = ~uVar3 + len;
          if (uVar13 < 2) goto LAB_00cf0fe6;
          local_68.result = 0;
          uVar14 = 1;
          goto LAB_00cf0f68;
        }
        uVar3 = uVar3 + 1;
      } while (len != uVar3);
    }
LAB_00cf0814:
    bVar18 = false;
LAB_00cf0816:
    if (bVar18 != false) {
      *local_38 = local_68.result;
    }
  }
  return bVar18;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}